

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableMessageFieldGenerator::GenerateBuilderMembers
          (ImmutableMessageFieldGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  int iVar1;
  char *text;
  char *nested_builder_case;
  char *regular_case;
  bool bVar2;
  
  iVar1 = *(int *)(*(long *)(this->descriptor_ + 0x30) + 0x8c);
  variables = &this->variables_;
  io::Printer::Print(printer,variables,"private $type$ $name$_ = null;\n");
  io::Printer::Print(printer,variables,
                     "private com.google.protobuf.SingleFieldBuilder$ver$<\n    $type$, $type$.Builder, $type$OrBuilder> $name$Builder_;\n"
                    );
  WriteFieldDocComment(printer,this->descriptor_);
  bVar2 = iVar1 == 3;
  text = 
  "$deprecation$public boolean has$capitalized_name$() {\n  return $get_has_field_bit_builder$;\n}\n"
  ;
  if (bVar2) {
    text = 
    "$deprecation$public boolean has$capitalized_name$() {\n  return $name$Builder_ != null || $name$_ != null;\n}\n"
    ;
  }
  nested_builder_case = "$name$Builder_.clear();\n";
  if (bVar2) {
    nested_builder_case = "$name$_ = null;\n$name$Builder_ = null;\n";
  }
  regular_case = 
  "if ($get_has_field_bit_builder$ &&\n    $name$_ != null &&\n    $name$_ != $type$.getDefaultInstance()) {\n  $name$_ =\n    $type$.newBuilder($name$_).mergeFrom(value).buildPartial();\n} else {\n  $name$_ = value;\n}\n$on_changed$\n"
  ;
  if (bVar2) {
    regular_case = 
    "if ($name$_ != null) {\n  $name$_ =\n    $type$.newBuilder($name$_).mergeFrom(value).buildPartial();\n} else {\n  $name$_ = value;\n}\n$on_changed$\n"
    ;
  }
  io::Printer::Print(printer,variables,text);
  WriteFieldDocComment(printer,this->descriptor_);
  PrintNestedBuilderFunction
            (this,printer,"$deprecation$public $type$ get$capitalized_name$()",
             "return $name$_ == null ? $type$.getDefaultInstance() : $name$_;\n",
             "return $name$Builder_.getMessage();\n",(char *)0x0);
  WriteFieldDocComment(printer,this->descriptor_);
  PrintNestedBuilderFunction
            (this,printer,"$deprecation$public Builder set$capitalized_name$($type$ value)",
             "if (value == null) {\n  throw new NullPointerException();\n}\n$name$_ = value;\n$on_changed$\n"
             ,"$name$Builder_.setMessage(value);\n","$set_has_field_bit_builder$\nreturn this;\n");
  WriteFieldDocComment(printer,this->descriptor_);
  PrintNestedBuilderFunction
            (this,printer,
             "$deprecation$public Builder set$capitalized_name$(\n    $type$.Builder builderForValue)"
             ,"$name$_ = builderForValue.build();\n$on_changed$\n",
             "$name$Builder_.setMessage(builderForValue.build());\n",
             "$set_has_field_bit_builder$\nreturn this;\n");
  WriteFieldDocComment(printer,this->descriptor_);
  PrintNestedBuilderFunction
            (this,printer,"$deprecation$public Builder merge$capitalized_name$($type$ value)",
             regular_case,"$name$Builder_.mergeFrom(value);\n",
             "$set_has_field_bit_builder$\nreturn this;\n");
  WriteFieldDocComment(printer,this->descriptor_);
  PrintNestedBuilderFunction
            (this,printer,"$deprecation$public Builder clear$capitalized_name$()",
             "$name$_ = null;\n$on_changed$\n",nested_builder_case,
             "$clear_has_field_bit_builder$\nreturn this;\n");
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,variables,
                     "$deprecation$public $type$.Builder get$capitalized_name$Builder() {\n  $set_has_field_bit_builder$\n  $on_changed$\n  return get$capitalized_name$FieldBuilder().getBuilder();\n}\n"
                    );
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,variables,
                     "$deprecation$public $type$OrBuilder get$capitalized_name$OrBuilder() {\n  if ($name$Builder_ != null) {\n    return $name$Builder_.getMessageOrBuilder();\n  } else {\n    return $name$_ == null ?\n        $type$.getDefaultInstance() : $name$_;\n  }\n}\n"
                    );
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,variables,
                     "private com.google.protobuf.SingleFieldBuilder$ver$<\n    $type$, $type$.Builder, $type$OrBuilder> \n    get$capitalized_name$FieldBuilder() {\n  if ($name$Builder_ == null) {\n    $name$Builder_ = new com.google.protobuf.SingleFieldBuilder$ver$<\n        $type$, $type$.Builder, $type$OrBuilder>(\n            get$capitalized_name$(),\n            getParentForChildren(),\n            isClean());\n    $name$_ = null;\n  }\n  return $name$Builder_;\n}\n"
                    );
  return;
}

Assistant:

void ImmutableMessageFieldGenerator::
GenerateBuilderMembers(io::Printer* printer) const {
  // When using nested-builders, the code initially works just like the
  // non-nested builder case. It only creates a nested builder lazily on
  // demand and then forever delegates to it after creation.

  bool support_field_presence = SupportFieldPresence(descriptor_->file());

  printer->Print(variables_,
    "private $type$ $name$_ = null;\n");

  printer->Print(variables_,
      // If this builder is non-null, it is used and the other fields are
      // ignored.
      "private com.google.protobuf.SingleFieldBuilder$ver$<\n"
      "    $type$, $type$.Builder, $type$OrBuilder> $name$Builder_;"
      "\n");

  // The comments above the methods below are based on a hypothetical
  // field of type "Field" called "Field".

  // boolean hasField()
  WriteFieldDocComment(printer, descriptor_);
  if (support_field_presence) {
    printer->Print(variables_,
      "$deprecation$public boolean has$capitalized_name$() {\n"
      "  return $get_has_field_bit_builder$;\n"
      "}\n");
  } else {
    printer->Print(variables_,
      "$deprecation$public boolean has$capitalized_name$() {\n"
      "  return $name$Builder_ != null || $name$_ != null;\n"
      "}\n");
  }

  // Field getField()
  WriteFieldDocComment(printer, descriptor_);
  PrintNestedBuilderFunction(printer,
    "$deprecation$public $type$ get$capitalized_name$()",
    "return $name$_ == null ? $type$.getDefaultInstance() : $name$_;\n",
    "return $name$Builder_.getMessage();\n",
    NULL);

  // Field.Builder setField(Field value)
  WriteFieldDocComment(printer, descriptor_);
  PrintNestedBuilderFunction(printer,
    "$deprecation$public Builder set$capitalized_name$($type$ value)",

    "if (value == null) {\n"
    "  throw new NullPointerException();\n"
    "}\n"
    "$name$_ = value;\n"
    "$on_changed$\n",

    "$name$Builder_.setMessage(value);\n",

    "$set_has_field_bit_builder$\n"
    "return this;\n");

  // Field.Builder setField(Field.Builder builderForValue)
  WriteFieldDocComment(printer, descriptor_);
  PrintNestedBuilderFunction(printer,
    "$deprecation$public Builder set$capitalized_name$(\n"
    "    $type$.Builder builderForValue)",

    "$name$_ = builderForValue.build();\n"
    "$on_changed$\n",

    "$name$Builder_.setMessage(builderForValue.build());\n",

    "$set_has_field_bit_builder$\n"
    "return this;\n");

  // Field.Builder mergeField(Field value)
  WriteFieldDocComment(printer, descriptor_);
  PrintNestedBuilderFunction(printer,
    "$deprecation$public Builder merge$capitalized_name$($type$ value)",

    support_field_presence
        ? "if ($get_has_field_bit_builder$ &&\n"
          "    $name$_ != null &&\n"
          "    $name$_ != $type$.getDefaultInstance()) {\n"
          "  $name$_ =\n"
          "    $type$.newBuilder($name$_).mergeFrom(value).buildPartial();\n"
          "} else {\n"
          "  $name$_ = value;\n"
          "}\n"
          "$on_changed$\n"
        : "if ($name$_ != null) {\n"
          "  $name$_ =\n"
          "    $type$.newBuilder($name$_).mergeFrom(value).buildPartial();\n"
          "} else {\n"
          "  $name$_ = value;\n"
          "}\n"
          "$on_changed$\n",

    "$name$Builder_.mergeFrom(value);\n",

    "$set_has_field_bit_builder$\n"
    "return this;\n");

  // Field.Builder clearField()
  WriteFieldDocComment(printer, descriptor_);
  PrintNestedBuilderFunction(printer,
    "$deprecation$public Builder clear$capitalized_name$()",

    "$name$_ = null;\n"
    "$on_changed$\n",

    support_field_presence
        ? "$name$Builder_.clear();\n"
        : "$name$_ = null;\n"
          "$name$Builder_ = null;\n",

    "$clear_has_field_bit_builder$\n"
    "return this;\n");

  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public $type$.Builder get$capitalized_name$Builder() {\n"
    "  $set_has_field_bit_builder$\n"
    "  $on_changed$\n"
    "  return get$capitalized_name$FieldBuilder().getBuilder();\n"
    "}\n");
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public $type$OrBuilder get$capitalized_name$OrBuilder() {\n"
    "  if ($name$Builder_ != null) {\n"
    "    return $name$Builder_.getMessageOrBuilder();\n"
    "  } else {\n"
    "    return $name$_ == null ?\n"
    "        $type$.getDefaultInstance() : $name$_;\n"
    "  }\n"
    "}\n");
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "private com.google.protobuf.SingleFieldBuilder$ver$<\n"
    "    $type$, $type$.Builder, $type$OrBuilder> \n"
    "    get$capitalized_name$FieldBuilder() {\n"
    "  if ($name$Builder_ == null) {\n"
    "    $name$Builder_ = new com.google.protobuf.SingleFieldBuilder$ver$<\n"
    "        $type$, $type$.Builder, $type$OrBuilder>(\n"
    "            get$capitalized_name$(),\n"
    "            getParentForChildren(),\n"
    "            isClean());\n"
    "    $name$_ = null;\n"
    "  }\n"
    "  return $name$Builder_;\n"
    "}\n");
}